

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdentifierCopier.cpp
# Opt level: O2

void __thiscall
phaeton::IdentifierCopier::transformIdentifierExpr(IdentifierCopier *this,IdentifierExpr *Node)

{
  string *__lhs;
  ExpressionNodeBuilder *this_00;
  bool bVar1;
  IdentifierExpr *pIVar2;
  ExprDims *__x;
  string Tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (*(Node->super_ExpressionNode)._vptr_ExpressionNode[7])(&Tmp);
  (*(this->CurrentLHS->super_ExpressionNode)._vptr_ExpressionNode[7])(&local_48);
  bVar1 = std::operator!=(&Tmp,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&Tmp);
  if (!bVar1) {
    __x = &(Node->super_ExpressionNode).Dims;
    bVar1 = std::operator==(__x,&(this->CurrentLHS->super_ExpressionNode).Dims);
    if (!bVar1) {
      __assert_fail("Node->getDims() == CurrentLHS->getDims()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lijiansong[P]Phaeton/lib/Opt/IdentifierCopier.cpp"
                    ,0x58,
                    "virtual void phaeton::IdentifierCopier::transformIdentifierExpr(IdentifierExpr *)"
                   );
    }
    if (this->Incompatible == true) {
      __lhs = &this->ReplaceName;
      bVar1 = std::operator!=(__lhs,"");
      if (bVar1) {
        std::__cxx11::string::string((string *)&Tmp,(string *)__lhs);
      }
      else {
        getTmp_abi_cxx11_(&Tmp,this);
      }
      pIVar2 = ExpressionNodeBuilder::createIdentifierExpr(this->CG->ExprNodeBuilder,&Tmp,__x);
      ExpressionNode::setChild(this->Parent,this->ChildIndex,&pIVar2->super_ExpressionNode);
      bVar1 = std::operator==(__lhs,"");
      if (bVar1) {
        std::__cxx11::string::_M_assign((string *)__lhs);
        this_00 = this->CG->ExprNodeBuilder;
        (*(this->CurrentLHS->super_ExpressionNode)._vptr_ExpressionNode[7])(&local_48);
        pIVar2 = ExpressionNodeBuilder::createIdentifierExpr
                           (this_00,&local_48,&(this->CurrentLHS->super_ExpressionNode).Dims);
        std::__cxx11::string::~string((string *)&local_48);
        local_48._M_dataplus._M_p =
             (pointer)ExpressionNodeBuilder::createIdentifierExpr
                                (this->CG->ExprNodeBuilder,__lhs,__x);
        local_48._M_string_length = (size_type)pIVar2;
        std::__cxx11::
        list<phaeton::CodeGen::Assignment,_std::allocator<phaeton::CodeGen::Assignment>_>::
        emplace<phaeton::CodeGen::Assignment>
                  (this->Assignments,(this->CurrentPos)._M_node,(Assignment *)&local_48);
      }
      std::__cxx11::string::~string((string *)&Tmp);
    }
  }
  return;
}

Assistant:

void IdentifierCopier::transformIdentifierExpr(IdentifierExpr *Node) {
  // Note that current identifier should be different from 'LHS'.
  if (Node->getName() != CurrentLHS->getName()) {
    return;
  }

  // Note that identifiers with the same name must have the same type, here we
  // only check the dimension.
  assert(Node->getDims() == CurrentLHS->getDims());

  // If index structures of 'LHS' and the current identifier are compatible
  if (!Incompatible) {
    return;
  }

  // If we get here, that means current identifier must be replaced.
  // If there isn't a replacement for the identifier yet, we need to create a
  // name for it.
  const std::string Tmp = (ReplaceName != "") ? ReplaceName : getTmp();

  ExpressionNode *NewIdNode =
      getExprNodeBuilder()->createIdentifierExpr(Tmp, Node->getDims());
  Parent->setChild(ChildIndex, NewIdNode);

  // Note that if there wasn't a replacement identifier, we can simply assign
  // 'LHS' to it.
  if (ReplaceName == "") {
    ReplaceName = Tmp;
    ExpressionNode *CopyLHSId = getExprNodeBuilder()->createIdentifierExpr(
        CurrentLHS->getName(), CurrentLHS->getDims());
    ExpressionNode *NewRHSId = getExprNodeBuilder()->createIdentifierExpr(
        ReplaceName, Node->getDims());
    // Note: Replacement identifier for 'RHS' must be assigned the
    // value of 'LHS' before current assignment.
    // TODO: To make the insertion clear, we need to add a wrapper for
    // insertBefore and insertAfter.
    Assignments.insert(CurrentPos, {NewRHSId, CopyLHSId});
  }
}